

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csg_parser.cpp
# Opt level: O1

object * __thiscall ocmesh::details::parser::parse_primitive(parser *this)

{
  pointer pcVar1;
  uint64_t uVar2;
  sphere_t *psVar3;
  string name;
  long *local_c0;
  size_t local_b8;
  long local_b0 [2];
  token local_a0;
  token local_70;
  token local_40;
  
  if ((this->_current)._kind == primitive) {
    pcVar1 = (this->_current)._text._M_dataplus._M_p;
    local_c0 = local_b0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c0,pcVar1,pcVar1 + (this->_current)._text._M_string_length);
    lex<ocmesh::details::token::kind_t,_void,_0>(&local_40,this,lparen);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._text._M_dataplus._M_p != &local_40._text.field_2) {
      operator_delete(local_40._text._M_dataplus._M_p,
                      local_40._text.field_2._M_allocated_capacity + 1);
    }
    lex<ocmesh::details::token::kind_t,_void,_0>(&local_a0,this,number);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._text._M_dataplus._M_p != &local_a0._text.field_2) {
      operator_delete(local_a0._text._M_dataplus._M_p,
                      local_a0._text.field_2._M_allocated_capacity + 1);
    }
    lex<ocmesh::details::token::kind_t,_void,_0>(&local_70,this,rparen);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._text._M_dataplus._M_p != &local_70._text.field_2) {
      operator_delete(local_70._text._M_dataplus._M_p,
                      local_70._text.field_2._M_allocated_capacity + 1);
    }
    uVar2 = utils::details::hash((char *)local_c0,local_b8,0xcbf29ce484222325);
    if (uVar2 == 0x4c5f6190acb3dc80) {
      local_a0._kind = (kind_t)local_a0._value;
      psVar3 = (sphere_t *)
               scene::make<ocmesh::details::cube_t,_float_&,_void,_0>
                         (this->_scene,(float *)&local_a0);
    }
    else {
      local_a0._kind = (kind_t)local_a0._value;
      psVar3 = scene::make<ocmesh::details::sphere_t,_float_&,_void,_0>
                         (this->_scene,(float *)&local_a0);
    }
    if (local_c0 != local_b0) {
      operator_delete(local_c0,local_b0[0] + 1);
    }
    return &psVar3->super_object;
  }
  __assert_fail("_current.is(token::primitive)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/nicola-gigante[P]ocmesh/src/csg_parser.cpp"
                ,0x122,"object *ocmesh::details::parser::parse_primitive()");
}

Assistant:

bool is(kind_t k) const {
            return _kind == k;
        }